

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O0

void __thiscall
Color::Color(Color *this,color_id fg,color_id bg,bool underline,bool bold,bool bright)

{
  bool bright_local;
  bool bold_local;
  bool underline_local;
  color_id bg_local;
  color_id fg_local;
  Color *this_local;
  
  this->_value = 0;
  this->_value = (uint)underline << 0x12 | (uint)bold << 0x11 | (uint)bright << 0x10 | this->_value;
  if (bg != nocolor) {
    this->_value = this->_value | 0x100000;
    this->_value = bg << 8 | this->_value;
  }
  if (fg != nocolor) {
    this->_value = this->_value | 0x80000;
    this->_value = fg | this->_value;
  }
  return;
}

Assistant:

Color::Color (color_id fg, color_id bg, bool underline, bool bold, bool bright)
: _value (0)
{
#ifdef FEATURE_COLOR
  _value |= ((underline ? 1 : 0) << 18)
         |  ((bold      ? 1 : 0) << 17)
         |  ((bright    ? 1 : 0) << 16);

  if (bg != Color::nocolor)
  {
    _value |= _COLOR_HASBG;
    _value |= (bg << 8);
  }

  if (fg != Color::nocolor)
  {
    _value |= _COLOR_HASFG;
    _value |= fg;
  }
#endif
}